

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper_template.h
# Opt level: O0

int compute_all_sarb(uint8_t dst,uint8_t src1)

{
  byte bVar1;
  target_long tVar2;
  target_long tVar3;
  int of;
  int sf;
  int zf;
  int af;
  int pf;
  int cf;
  uint8_t src1_local;
  uint8_t dst_local;
  
  bVar1 = "\x04"[dst];
  tVar2 = lshift((ulong)dst,0);
  tVar3 = lshift((long)(int)(uint)(src1 ^ dst),4);
  return src1 & 1 | (uint)bVar1 | (uint)(dst == '\0') << 6 | (uint)tVar2 & 0x80 |
         (uint)tVar3 & 0x800;
}

Assistant:

static int glue(compute_all_sar, SUFFIX)(DATA_TYPE dst, DATA_TYPE src1)
{
    int cf, pf, af, zf, sf, of;

    cf = src1 & 1;
    pf = parity_table[(uint8_t)dst];
    af = 0; /* undefined */
    zf = (dst == 0) * CC_Z;
    sf = lshift(dst, 8 - DATA_BITS) & CC_S;
    /* of is defined iff shift count == 1 */
    of = lshift(src1 ^ dst, 12 - DATA_BITS) & CC_O;
    return cf | pf | af | zf | sf | of;
}